

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcolor.c
# Opt level: O2

void ycc_rgb565D_convert(j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION input_row,
                        JSAMPARRAY output_buf,int num_rows)

{
  jpeg_color_deconverter *pjVar1;
  JSAMPLE *pJVar2;
  _func_void_j_decompress_ptr *p_Var3;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_JSAMPARRAY_int *p_Var4;
  _func_void_j_decompress_ptr *p_Var5;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_JSAMPARRAY_int *p_Var6;
  uint uVar7;
  ulong uVar8;
  ushort *puVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  byte *pbVar14;
  ulong uVar15;
  uint local_9c;
  uint local_98;
  int local_94;
  byte *local_68;
  byte *local_60;
  JSAMPARRAY local_58;
  
  pjVar1 = cinfo->cconvert;
  local_9c = cinfo->output_width;
  pJVar2 = cinfo->sample_range_limit;
  p_Var3 = pjVar1[1].start_pass;
  p_Var4 = pjVar1[1].color_convert;
  p_Var5 = pjVar1[2].start_pass;
  p_Var6 = pjVar1[2].color_convert;
  uVar12 = dither_matrix[cinfo->output_scanline & 3];
  local_98 = input_row;
  local_94 = num_rows;
  local_58 = output_buf;
  while (0 < local_94) {
    uVar8 = (ulong)local_98;
    pbVar14 = (*input_buf)[uVar8];
    local_60 = input_buf[1][uVar8];
    local_68 = input_buf[2][uVar8];
    puVar9 = (ushort *)*local_58;
    if (((ulong)puVar9 & 3) != 0) {
      uVar8 = (ulong)*pbVar14;
      uVar10 = uVar12 & 0xff;
      *puVar9 = (ushort)(pJVar2[(long)*(int *)(p_Var4 + (ulong)*local_60 * 4) + uVar8 + uVar10] >> 3
                        ) |
                (pJVar2[(long)*(int *)(p_Var3 + (ulong)*local_68 * 4) + uVar8 + uVar10] & 0xfff8) *
                0x100 + (pJVar2[(long)(int)((ulong)(*(long *)(p_Var5 + (ulong)*local_68 * 8) +
                                                   *(long *)(p_Var6 + (ulong)*local_60 * 8)) >> 0x10
                                           ) + uVar8 + (uVar10 >> 1)] & 0xfc) * 8;
      pbVar14 = pbVar14 + 1;
      local_60 = local_60 + 1;
      local_68 = local_68 + 1;
      puVar9 = puVar9 + 1;
      local_9c = local_9c - 1;
    }
    local_94 = local_94 + -1;
    local_98 = local_98 + 1;
    local_58 = local_58 + 1;
    for (lVar13 = 0; local_9c >> 1 != (uint)lVar13; lVar13 = lVar13 + 1) {
      uVar8 = (ulong)pbVar14[lVar13 * 2];
      uVar10 = uVar12 & 0xff;
      uVar7 = (uint)(uVar12 >> 8);
      uVar15 = (ulong)pbVar14[lVar13 * 2 + 1];
      uVar11 = uVar12 >> 8 & 0xff;
      uVar12 = (ulong)(uVar7 << 0x18 | (uVar7 & 0xffff00 | (int)uVar12 << 0x18) >> 8);
      *(uint *)(puVar9 + lVar13 * 2) =
           ((uint)(pJVar2[(long)*(int *)(p_Var4 + (ulong)local_60[lVar13 * 2 + 1] * 4) + uVar15 +
                          uVar11] >> 3) |
           (pJVar2[(long)*(int *)(p_Var3 + (ulong)local_68[lVar13 * 2 + 1] * 4) + uVar15 + uVar11] &
           0xf8) * 0x100 +
           (pJVar2[(long)(int)((ulong)(*(long *)(p_Var5 + (ulong)local_68[lVar13 * 2 + 1] * 8) +
                                      *(long *)(p_Var6 + (ulong)local_60[lVar13 * 2 + 1] * 8)) >>
                              0x10) + uVar15 + (uVar11 >> 1)] & 0xfc) * 8) << 0x10 |
           (uint)(pJVar2[(long)*(int *)(p_Var4 + (ulong)local_60[lVar13 * 2] * 4) + uVar8 + uVar10]
                 >> 3) |
           (pJVar2[(long)*(int *)(p_Var3 + (ulong)local_68[lVar13 * 2] * 4) + uVar8 + uVar10] & 0xf8
           ) * 0x100 +
           (pJVar2[(long)(int)((ulong)(*(long *)(p_Var5 + (ulong)local_68[lVar13 * 2] * 8) +
                                      *(long *)(p_Var6 + (ulong)local_60[lVar13 * 2] * 8)) >> 0x10)
                   + uVar8 + (uVar10 >> 1)] & 0xfc) * 8;
    }
    if ((local_9c & 1) != 0) {
      uVar8 = (ulong)pbVar14[lVar13 * 2];
      uVar10 = uVar12 & 0xff;
      puVar9[lVar13 * 2] =
           (ushort)(pJVar2[(long)*(int *)(p_Var4 + (ulong)local_60[lVar13 * 2] * 4) + uVar8 + uVar10
                          ] >> 3) |
           (pJVar2[(long)*(int *)(p_Var3 + (ulong)local_68[lVar13 * 2] * 4) + uVar8 + uVar10] &
           0xfff8) * 0x100 +
           (pJVar2[(long)(int)((ulong)(*(long *)(p_Var5 + (ulong)local_68[lVar13 * 2] * 8) +
                                      *(long *)(p_Var6 + (ulong)local_60[lVar13 * 2] * 8)) >> 0x10)
                   + uVar8 + (uVar10 >> 1)] & 0xfc) * 8;
    }
  }
  return;
}

Assistant:

METHODDEF(void)
ycc_rgb565D_convert(j_decompress_ptr cinfo, JSAMPIMAGE input_buf,
                    JDIMENSION input_row, JSAMPARRAY output_buf, int num_rows)
{
  if (is_big_endian())
    ycc_rgb565D_convert_be(cinfo, input_buf, input_row, output_buf, num_rows);
  else
    ycc_rgb565D_convert_le(cinfo, input_buf, input_row, output_buf, num_rows);
}